

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

bcf_hrec_t * bcf_hdr_parse_line(bcf_hdr_t *h,char *line,int *len)

{
  int iVar1;
  int iVar2;
  uint is_quoted;
  char *pcVar3;
  char *pcVar4;
  bcf_idpair_t *pbVar5;
  ushort **ppuVar6;
  bool bVar7;
  undefined1 local_68 [4];
  int quoted;
  kstring_t tmp;
  int nopen;
  bcf_hrec_t *hrec;
  char *pcStack_38;
  int n;
  char *q;
  char *p;
  int *len_local;
  char *line_local;
  bcf_hdr_t *h_local;
  
  if ((*line == '#') && (line[1] == '#')) {
    pcVar3 = line + 2;
    pcStack_38 = pcVar3;
    while( true ) {
      bVar7 = false;
      if (*pcStack_38 != '\0') {
        bVar7 = *pcStack_38 != '=';
      }
      if (!bVar7) break;
      pcStack_38 = pcStack_38 + 1;
    }
    iVar2 = (int)pcStack_38 - (int)pcVar3;
    iVar1 = (int)line;
    if ((*pcStack_38 == '=') && (iVar2 != 0)) {
      h_local = (bcf_hdr_t *)calloc(1,0x30);
      pcVar4 = (char *)malloc((long)(iVar2 + 1));
      *(char **)(h_local->n + 2) = pcVar4;
      memcpy(*(char **)(h_local->n + 2),pcVar3,(long)iVar2);
      (*(char **)(h_local->n + 2))[iVar2] = '\0';
      pcVar3 = pcStack_38 + 1;
      pcStack_38 = pcVar3;
      if (*pcVar3 == '<') {
        tmp.s._4_4_ = 1;
        while( true ) {
          bVar7 = false;
          if ((*pcStack_38 != '\0') && (bVar7 = false, *pcStack_38 != '\n')) {
            bVar7 = tmp.s._4_4_ != 0;
          }
          if (!bVar7) {
            *len = ((int)pcStack_38 - iVar1) + 1;
            return (bcf_hrec_t *)h_local;
          }
          pcVar3 = pcStack_38 + 1;
          pcStack_38 = pcVar3;
          while( true ) {
            bVar7 = false;
            if (*pcStack_38 != '\0') {
              ppuVar6 = __ctype_b_loc();
              bVar7 = ((*ppuVar6)[(int)*pcStack_38] & 8) != 0;
            }
            if (!bVar7) break;
            pcStack_38 = pcStack_38 + 1;
          }
          if ((*pcStack_38 != '=') || ((int)pcStack_38 == (int)pcVar3)) break;
          bcf_hrec_add_key((bcf_hrec_t *)h_local,pcVar3,(int)pcStack_38 - (int)pcVar3);
          q = pcStack_38 + 1;
          is_quoted = (uint)(*q == '\"');
          pcVar3 = q;
          if (is_quoted != 0) {
            q = pcStack_38 + 2;
            pcVar3 = q;
          }
          while (pcStack_38 = pcVar3, *pcStack_38 != '\0') {
            if (is_quoted == 0) {
              if (*pcStack_38 == '<') {
                tmp.s._4_4_ = tmp.s._4_4_ + 1;
              }
              if (*pcStack_38 == '>') {
                tmp.s._4_4_ = tmp.s._4_4_ + -1;
              }
              if ((tmp.s._4_4_ == 0) || ((*pcStack_38 == ',' && (tmp.s._4_4_ == 1)))) break;
            }
            else if ((*pcStack_38 == '\"') && (iVar2 = is_escaped(q,pcStack_38), iVar2 == 0)) break;
            pcVar3 = pcStack_38 + 1;
          }
          bcf_hrec_set_val((bcf_hrec_t *)h_local,*(int *)(h_local->id + 1) + -1,q,
                           (int)pcStack_38 - (int)q,is_quoted);
          if (is_quoted != 0) {
            pcStack_38 = pcStack_38 + 1;
          }
          if (*pcStack_38 == '>') {
            tmp.s._4_4_ = tmp.s._4_4_ + -1;
            pcStack_38 = pcStack_38 + 1;
          }
        }
        while( true ) {
          bVar7 = false;
          if (*pcStack_38 != '\0') {
            bVar7 = *pcStack_38 != '\n';
          }
          if (!bVar7) break;
          pcStack_38 = pcStack_38 + 1;
        }
        memset(local_68,0,0x18);
        kputsn(line,(int)pcStack_38 - iVar1,(kstring_t *)local_68);
        fprintf(_stderr,"Could not parse the header line: \"%s\"\n",tmp.m);
        free((void *)tmp.m);
        *len = ((int)pcStack_38 - iVar1) + 1;
        bcf_hrec_destroy((bcf_hrec_t *)h_local);
        h_local = (bcf_hdr_t *)0x0;
      }
      else {
        while( true ) {
          bVar7 = false;
          if (*pcStack_38 != '\0') {
            bVar7 = *pcStack_38 != '\n';
          }
          if (!bVar7) break;
          pcStack_38 = pcStack_38 + 1;
        }
        pbVar5 = (bcf_idpair_t *)malloc((size_t)(pcStack_38 + (1 - (long)pcVar3)));
        h_local->id[0] = pbVar5;
        memcpy(h_local->id[0],pcVar3,(long)pcStack_38 - (long)pcVar3);
        *(char *)((long)h_local->id[0] + ((long)pcStack_38 - (long)pcVar3)) = '\0';
        *len = ((int)pcStack_38 - iVar1) + 1;
      }
    }
    else {
      *len = ((int)pcStack_38 - iVar1) + 1;
      h_local = (bcf_hdr_t *)0x0;
    }
  }
  else {
    *len = 0;
    h_local = (bcf_hdr_t *)0x0;
  }
  return (bcf_hrec_t *)h_local;
}

Assistant:

bcf_hrec_t *bcf_hdr_parse_line(const bcf_hdr_t *h, const char *line, int *len)
{
    const char *p = line;
    if (p[0] != '#' || p[1] != '#') { *len = 0; return NULL; }
    p += 2;

    const char *q = p;
    while ( *q && *q!='=' ) q++;
    int n = q-p;
    if ( *q!='=' || !n ) { *len = q-line+1; return NULL; } // wrong format

    bcf_hrec_t *hrec = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
    hrec->key = (char*) malloc(sizeof(char)*(n+1));
    memcpy(hrec->key,p,n);
    hrec->key[n] = 0;

    p = ++q;
    if ( *p!='<' ) // generic field, e.g. ##samtoolsVersion=0.1.18-r579
    {
        while ( *q && *q!='\n' ) q++;
        hrec->value = (char*) malloc((q-p+1)*sizeof(char));
        memcpy(hrec->value, p, q-p);
        hrec->value[q-p] = 0;
        *len = q-line+1;
        return hrec;
    }

    // structured line, e.g. ##INFO=<ID=PV1,Number=1,Type=Float,Description="P-value for baseQ bias">
    int nopen = 1;
    while ( *q && *q!='\n' && nopen )
    {
        p = ++q;
        while ( *q && isalnum(*q) ) q++;
        n = q-p;
        if ( *q!='=' || !n )
        {
            // wrong format
            while ( *q && *q!='\n' ) q++;
            kstring_t tmp = {0,0,0};
            kputsn(line,q-line,&tmp);
            fprintf(stderr,"Could not parse the header line: \"%s\"\n", tmp.s);
            free(tmp.s);
            *len = q-line+1;
            bcf_hrec_destroy(hrec);
            return NULL;
        }
        bcf_hrec_add_key(hrec, p, q-p);
        p = ++q;
        int quoted = *p=='"' ? 1 : 0;
        if ( quoted ) p++, q++;
        while (1)
        {
            if ( !*q ) break;
            if ( quoted ) { if ( *q=='"' && !is_escaped(p,q) ) break; }
            else
            {
                if ( *q=='<' ) nopen++;
                if ( *q=='>' ) nopen--;
                if ( !nopen ) break;
                if ( *q==',' && nopen==1 ) break;
            }
            q++;
        }
        bcf_hrec_set_val(hrec, hrec->nkeys-1, p, q-p, quoted);
        if ( quoted ) q++;
        if ( *q=='>' ) { nopen--; q++; }
    }
    *len = q-line+1;
    return hrec;
}